

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

bool __thiscall kj::HttpHeaders::parseHeaders(HttpHeaders *this,char *ptr,char *end)

{
  byte *pbVar1;
  char *pcVar2;
  char *p;
  long lVar3;
  StringPtr name;
  StringPtr value;
  char *local_40;
  char *local_38;
  
  local_38 = end;
  while( true ) {
    if (*ptr == '\0') {
      return ptr == local_38;
    }
    p = ptr + -1;
    lVar3 = 0;
    do {
      pbVar1 = (byte *)(p + 1);
      p = p + 1;
      lVar3 = lVar3 + -1;
    } while ((*(ulong *)((anonymous_namespace)::HTTP_HEADER_NAME_CHARS + (ulong)(*pbVar1 >> 6) * 8)
              >> ((ulong)*pbVar1 & 0x3f) & 1) != 0);
    pcVar2 = skipSpace(p);
    if ((lVar3 == -1) || (*pcVar2 != ':')) break;
    local_40 = skipSpace(pcVar2 + 1);
    *p = '\0';
    value = consumeLine(&local_40);
    name.content.size_ = -lVar3;
    name.content.ptr = ptr;
    addNoCheck(this,name,value);
    ptr = local_40;
  }
  return false;
}

Assistant:

bool HttpHeaders::parseHeaders(char* ptr, char* end) {
  while (*ptr != '\0') {
    KJ_IF_SOME(name, consumeHeaderName(ptr)) {
      kj::StringPtr line = consumeLine(ptr);
      addNoCheck(name, line);
    } else {
      return false;
    }
  }

  return ptr == end;
}